

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O0

void sylvan_gc_normal_resize_CALL(WorkerP *w,Task *__dq_head)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  Task *__dq_head_local;
  WorkerP *w_local;
  size_t cache_max;
  size_t cache_size;
  size_t new_size;
  size_t marked;
  size_t nodes_max;
  size_t nodes_size;
  
  sVar1 = llmsset_get_size(nodes);
  sVar2 = llmsset_get_max_size(nodes);
  if ((sVar1 < sVar2) &&
     (sVar3 = llmsset_count_marked_RUN(nodes), sVar1 <= sVar3 * 2 && sVar3 * 2 - sVar1 != 0)) {
    cache_size = next_size(sVar1);
    if (sVar2 < cache_size) {
      cache_size = sVar2;
    }
    llmsset_set_size(nodes,cache_size);
    sVar1 = cache_getsize();
    sVar2 = cache_getmaxsize();
    if (sVar1 < sVar2) {
      cache_size = next_size(sVar1);
      if (sVar2 < cache_size) {
        cache_size = sVar2;
      }
      cache_setsize(cache_size);
    }
  }
  return;
}

Assistant:

VOID_TASK_IMPL_0(sylvan_gc_normal_resize)
{
    size_t nodes_size = llmsset_get_size(nodes);
    size_t nodes_max = llmsset_get_max_size(nodes);
    if (nodes_size < nodes_max) {
        size_t marked = llmsset_count_marked(nodes);
        if (marked*2 > nodes_size) {
            size_t new_size = next_size(nodes_size);
            if (new_size > nodes_max) new_size = nodes_max;
            llmsset_set_size(nodes, new_size);

            // also increase the operation cache
            size_t cache_size = cache_getsize();
            size_t cache_max = cache_getmaxsize();
            if (cache_size < cache_max) {
                new_size = next_size(cache_size);
                if (new_size > cache_max) new_size = cache_max;
                cache_setsize(new_size);
            }
        }
    }
}